

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O3

int Abc_AigCheck(Abc_Aig_t *pMan)

{
  int *piVar1;
  void **ppvVar2;
  char *pcVar3;
  void *pvVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  uint uVar8;
  Abc_Ntk_t *pAVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  Abc_Obj_t *pAVar14;
  long lVar15;
  
  pAVar9 = pMan->pNtkAig;
  pVVar6 = pAVar9->vObjs;
  uVar8 = pVVar6->nSize;
  if (0 < (int)uVar8) {
    lVar15 = 0;
    do {
      pAVar14 = (Abc_Obj_t *)pVVar6->pArray[lVar15];
      if ((pAVar14 != (Abc_Obj_t *)0x0) &&
         (uVar8 = *(uint *)&pAVar14->field_0x14, (uVar8 & 0xf) == 7)) {
        iVar12 = (pAVar14->vFanins).nSize;
        if (iVar12 == 0) {
          if (**(int **)((ulong)pAVar14 & 0xfffffffffffffffe) != 3) {
            __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
          }
          if ((*(uint *)((long)((ulong)pAVar14 & 0xfffffffffffffffe) + 0x14) & 0xf) != 1) {
            pcVar3 = "Abc_AigCheck: The AIG has non-standard constant nodes.";
            goto LAB_00839342;
          }
        }
        else {
          if (iVar12 == 1) {
            pcVar3 = "Abc_AigCheck: The AIG has single input nodes.";
            goto LAB_00839342;
          }
          if (2 < iVar12) {
            pcVar3 = "Abc_AigCheck: The AIG has non-standard nodes.";
            goto LAB_00839342;
          }
          piVar1 = (pAVar14->vFanins).pArray;
          ppvVar2 = pAVar14->pNtk->vObjs->pArray;
          pvVar4 = ppvVar2[*piVar1];
          uVar11 = *(uint *)((long)pvVar4 + 0x14) >> 0xc;
          pvVar7 = ppvVar2[piVar1[1]];
          uVar13 = *(uint *)((long)pvVar7 + 0x14) >> 0xc;
          if (uVar13 < uVar11) {
            uVar13 = uVar11;
          }
          if (uVar8 >> 0xc != uVar13 + 1) {
            pcVar3 = Abc_ObjName(pAVar14);
            printf("Abc_AigCheck: Node \"%s\" has level that does not agree with the fanin levels.\n"
                   ,pcVar3);
            piVar1 = (pAVar14->vFanins).pArray;
            ppvVar2 = pAVar14->pNtk->vObjs->pArray;
            pvVar4 = ppvVar2[*piVar1];
            uVar8 = *(uint *)&pAVar14->field_0x14;
            pvVar7 = ppvVar2[piVar1[1]];
          }
          pAVar5 = Abc_AigAndLookup(pMan,(Abc_Obj_t *)((ulong)(uVar8 >> 10 & 1) ^ (ulong)pvVar4),
                                    (Abc_Obj_t *)((ulong)(uVar8 >> 0xb & 1) ^ (ulong)pvVar7));
          if (pAVar5 != pAVar14) {
            pcVar3 = Abc_ObjName(pAVar14);
            printf("Abc_AigCheck: Node \"%s\" is not in the structural hashing table.\n",pcVar3);
          }
        }
      }
      lVar15 = lVar15 + 1;
      pAVar9 = pMan->pNtkAig;
      pVVar6 = pAVar9->vObjs;
      uVar8 = pVVar6->nSize;
    } while (lVar15 < (int)uVar8);
  }
  if ((long)pMan->nBins < 1) {
    iVar12 = 0;
  }
  else {
    lVar15 = 0;
    iVar12 = 0;
    do {
      for (pAVar14 = pMan->pBins[lVar15]; pAVar14 != (Abc_Obj_t *)0x0; pAVar14 = pAVar14->pNext) {
        iVar12 = iVar12 + 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != pMan->nBins);
  }
  if (iVar12 == pAVar9->nObjCounts[7]) {
    iVar12 = 1;
    if (0 < (int)uVar8) {
      uVar10 = 0;
      do {
        pAVar14 = (Abc_Obj_t *)pVVar6->pArray[uVar10];
        if ((pAVar14 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar14->field_0x14 & 0xf) == 7)) {
          if (((ulong)pAVar14 & 1) != 0) {
            pcVar3 = "!Abc_ObjIsComplement(pNode)";
LAB_008393d9:
            __assert_fail(pcVar3,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
          }
          if (pAVar14->pNtk->ntkType != ABC_NTK_STRASH) {
            pcVar3 = "Abc_NtkIsStrash(pNode->pNtk)";
            goto LAB_008393d9;
          }
          if (((pAVar14->field_5).pData != (void *)0x0) &&
             (pAVar5 = pAVar14, 0 < (pAVar14->vFanouts).nSize)) {
            while (pAVar5 = (Abc_Obj_t *)(pAVar5->field_5).pData, pAVar5 != (Abc_Obj_t *)0x0) {
              if (0 < (pAVar5->vFanouts).nSize) {
                pcVar3 = Abc_ObjName(pAVar5);
                printf("Abc_AigCheck: Representative %s",pcVar3);
                pcVar3 = Abc_ObjName(pAVar14);
                printf(" of choice node %s has %d fanouts.\n",pcVar3,
                       (ulong)(uint)(pAVar5->vFanouts).nSize);
                return 0;
              }
            }
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar8);
    }
  }
  else {
    pcVar3 = "Abc_AigCheck: The number of nodes in the structural hashing table is wrong.";
LAB_00839342:
    puts(pcVar3);
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

int Abc_AigCheck( Abc_Aig_t * pMan )
{
    Abc_Obj_t * pObj, * pAnd;
    int i, nFanins, Counter;
    Abc_NtkForEachNode( pMan->pNtkAig, pObj, i )
    {
        nFanins = Abc_ObjFaninNum(pObj);
        if ( nFanins == 0 )
        {
            if ( !Abc_AigNodeIsConst(pObj) )
            {
                printf( "Abc_AigCheck: The AIG has non-standard constant nodes.\n" );
                return 0;
            }
            continue;
        }
        if ( nFanins == 1 )
        {
            printf( "Abc_AigCheck: The AIG has single input nodes.\n" );
            return 0;
        }
        if ( nFanins > 2 )
        {
            printf( "Abc_AigCheck: The AIG has non-standard nodes.\n" );
            return 0;
        }
        if ( pObj->Level != 1 + (unsigned)Abc_MaxInt( Abc_ObjFanin0(pObj)->Level, Abc_ObjFanin1(pObj)->Level ) )
            printf( "Abc_AigCheck: Node \"%s\" has level that does not agree with the fanin levels.\n", Abc_ObjName(pObj) );
        pAnd = Abc_AigAndLookup( pMan, Abc_ObjChild0(pObj), Abc_ObjChild1(pObj) );
        if ( pAnd != pObj )
            printf( "Abc_AigCheck: Node \"%s\" is not in the structural hashing table.\n", Abc_ObjName(pObj) );
    }
    // count the number of nodes in the table
    Counter = 0;
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pAnd )
            Counter++;
    if ( Counter != Abc_NtkNodeNum(pMan->pNtkAig) )
    {
        printf( "Abc_AigCheck: The number of nodes in the structural hashing table is wrong.\n" );
        return 0;
    }
    // if the node is a choice node, nodes in its class should not have fanouts
    Abc_NtkForEachNode( pMan->pNtkAig, pObj, i )
        if ( Abc_AigNodeIsChoice(pObj) )
            for ( pAnd = (Abc_Obj_t *)pObj->pData; pAnd; pAnd = (Abc_Obj_t *)pAnd->pData )
                if ( Abc_ObjFanoutNum(pAnd) > 0 )
                {
                    printf( "Abc_AigCheck: Representative %s", Abc_ObjName(pAnd) );
                    printf( " of choice node %s has %d fanouts.\n", Abc_ObjName(pObj), Abc_ObjFanoutNum(pAnd) );
                    return 0;
                }
    return 1;
}